

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlp.h
# Opt level: O0

void __thiscall seeta::fd::MLPLayer::SetSize(MLPLayer *this,int32_t inputDim,int32_t outputDim)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  
  if ((0 < in_ESI) && (0 < in_EDX)) {
    *(int *)(in_RDI + 4) = in_ESI;
    *(int *)(in_RDI + 8) = in_EDX;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)this,CONCAT44(inputDim,outputDim));
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)this,CONCAT44(inputDim,outputDim));
  }
  return;
}

Assistant:

inline void SetSize(int32_t inputDim, int32_t outputDim) {
    if (inputDim <= 0 || outputDim <= 0) {
      return;  // @todo handle the errors!!!
    }
    input_dim_ = inputDim;
    output_dim_ = outputDim;
    weights_.resize(inputDim * outputDim);
    bias_.resize(outputDim);
  }